

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.h
# Opt level: O0

void __thiscall OpenCLEnum::Device::Device(Device *this,Device *param_1)

{
  undefined4 uVar1;
  uint uVar2;
  Device *param_1_local;
  Device *this_local;
  
  this->id = param_1->id;
  uVar1 = *(undefined4 *)&param_1->field_0xc;
  this->vendor_id = param_1->vendor_id;
  *(undefined4 *)&this->field_0xc = uVar1;
  this->platform_id = param_1->platform_id;
  this->device_type = param_1->device_type;
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::__cxx11::string::string((string *)&this->vendor,(string *)&param_1->vendor);
  std::__cxx11::string::string((string *)&this->version,(string *)&param_1->version);
  uVar1 = *(undefined4 *)&param_1->field_0x84;
  this->compute_units = param_1->compute_units;
  *(undefined4 *)&this->field_0x84 = uVar1;
  this->mem_size = param_1->mem_size;
  uVar2 = param_1->nvidia_pci_bus_id;
  this->clock = param_1->clock;
  this->nvidia_pci_bus_id = uVar2;
  this->nvidia_pci_slot_id = param_1->nvidia_pci_slot_id;
  this->has_cl_khr_spir = param_1->has_cl_khr_spir;
  return;
}

Assistant:

Device()
		{
			device_type			= 0;
			compute_units		= 0;
			mem_size			= 0;
			clock				= 0;
			nvidia_pci_bus_id	= 0;
			nvidia_pci_slot_id	= 0;
			has_cl_khr_spir		= false;
		}